

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

BufferOrError * __thiscall
slang::SourceManager::readHeader
          (BufferOrError *__return_storage_ptr__,SourceManager *this,string_view path,
          SourceLocation includedFrom,SourceLibrary *library,bool isSystemPath,
          span<const_std::filesystem::__cxx11::path,_18446744073709551615UL> additionalIncludePaths)

{
  path *ppVar1;
  pointer pvVar2;
  pointer ppVar3;
  char cVar4;
  char *pcVar5;
  path *d;
  path *ppVar6;
  path *dir;
  pointer __lhs;
  ulong uVar7;
  long lVar8;
  path p;
  path local_90;
  path local_68;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = path._M_str;
  local_40._M_len = path._M_len;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_68,&local_40,auto_format);
  cVar4 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar4 == '\0') {
    if (isSystemPath) {
      std::__shared_mutex_pthread::lock_shared(&(this->includeDirMutex)._M_impl);
      ppVar6 = (this->systemDirectories).
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->systemDirectories).
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar6 != ppVar1) {
        do {
          std::filesystem::__cxx11::operator/(&local_90,ppVar6,&local_68);
          openCached(__return_storage_ptr__,this,&local_90,includedFrom,library,0xffffffffffffffff);
          std::filesystem::__cxx11::path::~path(&local_90);
          if ((__return_storage_ptr__->contained).
              super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
          goto LAB_001d34e7;
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != ppVar1);
      }
    }
    else {
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
      uVar7 = (ulong)includedFrom & 0xfffffff;
      if ((((uVar7 == 0) ||
           (pvVar2 = (this->bufferEntries).
                     super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (ulong)((long)(this->bufferEntries).
                         super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 6) <= uVar7))
          || (*(__index_type *)
               ((long)&pvVar2[uVar7].
                       super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               + 0x38) != '\0')) ||
         (lVar8 = *(long *)&pvVar2[uVar7].
                            super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                            .
                            super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                            .
                            super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         , lVar8 == 0)) {
        pthread_rwlock_unlock((pthread_rwlock_t *)this);
      }
      else {
        ppVar6 = *(path **)(lVar8 + 0x78);
        pthread_rwlock_unlock((pthread_rwlock_t *)this);
        if (ppVar6 != (path *)0x0) {
          std::filesystem::__cxx11::operator/(&local_90,ppVar6,&local_68);
          openCached(__return_storage_ptr__,this,&local_90,includedFrom,library,0xffffffffffffffff);
          std::filesystem::__cxx11::path::~path(&local_90);
          if ((__return_storage_ptr__->contained).
              super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
          goto LAB_001d34ef;
        }
      }
      if (additionalIncludePaths._M_extent._M_extent_value != 0) {
        lVar8 = additionalIncludePaths._M_extent._M_extent_value * 0x28;
        do {
          std::filesystem::__cxx11::operator/(&local_90,additionalIncludePaths._M_ptr,&local_68);
          openCached(__return_storage_ptr__,this,&local_90,includedFrom,library,0xffffffffffffffff);
          std::filesystem::__cxx11::path::~path(&local_90);
          if ((__return_storage_ptr__->contained).
              super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
          goto LAB_001d34ef;
          additionalIncludePaths._M_ptr = additionalIncludePaths._M_ptr + 1;
          lVar8 = lVar8 + -0x28;
        } while (lVar8 != 0);
      }
      if (library != (SourceLibrary *)0x0) {
        __lhs = (library->includeDirs).
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = (library->includeDirs).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__lhs != ppVar3) {
          do {
            std::filesystem::__cxx11::operator/(&local_90,__lhs,&local_68);
            openCached(__return_storage_ptr__,this,&local_90,includedFrom,library,0xffffffffffffffff
                      );
            std::filesystem::__cxx11::path::~path(&local_90);
            if ((__return_storage_ptr__->contained).
                super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
            goto LAB_001d34ef;
            __lhs = __lhs + 1;
          } while (__lhs != ppVar3);
        }
      }
      std::__shared_mutex_pthread::lock_shared(&(this->includeDirMutex)._M_impl);
      ppVar6 = (this->userDirectories).
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->userDirectories).
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar6 != ppVar1) {
        do {
          std::filesystem::__cxx11::operator/(&local_90,ppVar6,&local_68);
          openCached(__return_storage_ptr__,this,&local_90,includedFrom,library,0xffffffffffffffff);
          std::filesystem::__cxx11::path::~path(&local_90);
          if ((__return_storage_ptr__->contained).
              super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
          goto LAB_001d34e7;
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != ppVar1);
      }
    }
    pcVar5 = (char *)std::_V2::generic_category();
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    m_has_value = false;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_error._M_value = 2;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.data._M_str = pcVar5;
LAB_001d34e7:
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->includeDirMutex);
  }
  else {
    openCached(__return_storage_ptr__,this,&local_68,includedFrom,library,0xffffffffffffffff);
  }
LAB_001d34ef:
  std::filesystem::__cxx11::path::~path(&local_68);
  return __return_storage_ptr__;
}

Assistant:

SourceManager::BufferOrError SourceManager::readHeader(
    std::string_view path, SourceLocation includedFrom, const SourceLibrary* library,
    bool isSystemPath, std::span<std::filesystem::path const> additionalIncludePaths) {

    // if the header is specified as an absolute path, just do a straight lookup
    SLANG_ASSERT(!path.empty());
    fs::path p = path;
    if (p.is_absolute())
        return openCached(p, includedFrom, library);

    // system path lookups only look in system directories
    if (isSystemPath) {
        // Separate lock for the include dirs here so that we can iterate
        // over them without having to make a copy. It's unlikely that the
        // list is being modified while we're reading headers anyway.
        std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
        for (auto& d : systemDirectories) {
            auto result = openCached(d / p, includedFrom, library);
            if (result)
                return result;
        }
        return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
    }

    // search relative to the current file
    const fs::path* currFileDir = nullptr;
    {
        std::shared_lock<std::shared_mutex> lock(mutex);
        auto info = getFileInfo(includedFrom.buffer(), lock);
        if (info && info->data)
            currFileDir = info->data->directory;
    }

    if (currFileDir) {
        auto result = openCached(*currFileDir / p, includedFrom, library);
        if (result)
            return result;
    }

    for (auto& dir : additionalIncludePaths) {
        auto result = openCached(dir / p, includedFrom, library);
        if (result)
            return result;
    }

    // Use library-specific include dirs if they exist.
    if (library) {
        for (auto& dir : library->includeDirs) {
            auto result = openCached(dir / p, includedFrom, library);
            if (result)
                return result;
        }
    }

    // See comment above about this separate mutex / lock.
    std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
    for (auto& d : userDirectories) {
        auto result = openCached(d / p, includedFrom, library);
        if (result)
            return result;
    }

    return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
}